

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenAddTableImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName)

{
  Table *pTVar1;
  string_view local_58;
  Name local_48;
  _Head_base<0UL,_wasm::Table_*,_false> local_38;
  __single_object table;
  
  wasm::Name::Name((Name *)&local_58,internalName);
  pTVar1 = wasm::Module::getTableOrNull(module,(Name)local_58);
  if (pTVar1 == (Table *)0x0) {
    std::make_unique<wasm::Table>();
    wasm::Name::Name(&local_48,internalName);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         local_48.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         local_48.super_IString.str._M_str;
    wasm::Name::Name(&local_48,externalModuleName);
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         local_48.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str =
         local_48.super_IString.str._M_str;
    wasm::Name::Name(&local_48,externalBaseName);
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         local_48.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str =
         local_48.super_IString.str._M_str;
    wasm::Module::addTable
              (module,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_38);
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
              ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_38);
  }
  else {
    wasm::Name::Name(&local_48,externalModuleName);
    (pTVar1->super_Importable).module.super_IString.str._M_len = local_48.super_IString.str._M_len;
    (pTVar1->super_Importable).module.super_IString.str._M_str = local_48.super_IString.str._M_str;
    wasm::Name::Name(&local_48,externalBaseName);
    (pTVar1->super_Importable).base.super_IString.str._M_len = local_48.super_IString.str._M_len;
    (pTVar1->super_Importable).base.super_IString.str._M_str = local_48.super_IString.str._M_str;
  }
  return;
}

Assistant:

void BinaryenAddTableImport(BinaryenModuleRef module,
                            const char* internalName,
                            const char* externalModuleName,
                            const char* externalBaseName) {
  auto* table = ((Module*)module)->getTableOrNull(internalName);
  if (table == nullptr) {
    auto table = std::make_unique<Table>();
    table->name = internalName;
    table->module = externalModuleName;
    table->base = externalBaseName;
    ((Module*)module)->addTable(std::move(table));
  } else {
    // already exists so just set module and base
    table->module = externalModuleName;
    table->base = externalBaseName;
  }
}